

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O1

void __thiscall coro_io::io_context_pool::run(io_context_pool *this)

{
  int iVar1;
  ostream *poVar2;
  pointer psVar3;
  long lVar4;
  size_t __cpu;
  ulong uVar5;
  bool bVar6;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> threads;
  cpu_set_t cpuset;
  anon_class_1_0_00000001_for__M_head_impl local_da;
  undefined1 local_d9;
  vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_> local_d8;
  cpu_set_t local_b8;
  
  LOCK();
  bVar6 = (this->has_run_or_stop_)._M_base._M_i == false;
  if (bVar6) {
    (this->has_run_or_stop_)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar6) {
    local_d8.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar3 = (this->io_contexts_).
             super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->io_contexts_).
        super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar3) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        local_b8.__bits[0] = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::thread,std::allocator<std::thread>,coro_io::io_context_pool::run()::_lambda(std::shared_ptr<asio::io_context>)_1_,std::shared_ptr<asio::io_context>&>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8.__bits + 1),
                   (thread **)&local_b8,(allocator<std::thread> *)&local_d9,&local_da,
                   (shared_ptr<asio::io_context> *)
                   ((long)&(psVar3->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar4));
        std::vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>::
        emplace_back<std::shared_ptr<std::thread>>
                  ((vector<std::shared_ptr<std::thread>,std::allocator<std::shared_ptr<std::thread>>>
                    *)&local_d8,(shared_ptr<std::thread> *)&local_b8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.__bits[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.__bits[1]);
        }
        if (this->cpu_affinity_ == true) {
          local_b8.__bits[0xe] = 0;
          local_b8.__bits[0xf] = 0;
          local_b8.__bits[0xc] = 0;
          local_b8.__bits[0xd] = 0;
          local_b8.__bits[10] = 0;
          local_b8.__bits[0xb] = 0;
          local_b8.__bits[8] = 0;
          local_b8.__bits[9] = 0;
          local_b8.__bits[6] = 0;
          local_b8.__bits[7] = 0;
          local_b8.__bits[4] = 0;
          local_b8.__bits[5] = 0;
          local_b8.__bits[2] = 0;
          local_b8.__bits[3] = 0;
          local_b8.__bits[0] = 0;
          local_b8.__bits[1] = 0;
          if (uVar5 < 0x400) {
            local_b8.__bits[uVar5 >> 6] = local_b8.__bits[uVar5 >> 6] | 1L << ((byte)uVar5 & 0x3f);
          }
          iVar1 = pthread_setaffinity_np
                            (((local_d8.
                               super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].
                               super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             _M_id)._M_thread,0x80,&local_b8);
          if (iVar1 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error calling pthread_setaffinity_np: ",0x26);
            poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          }
        }
        uVar5 = uVar5 + 1;
        psVar3 = (this->io_contexts_).
                 super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < (ulong)((long)(this->io_contexts_).
                                     super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)
              );
    }
    if (local_d8.
        super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_d8.
        super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      do {
        std::thread::join();
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)local_d8.
                                     super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_d8.
                                     super__Vector_base<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    std::promise<void>::set_value(&this->promise_);
    std::vector<std::shared_ptr<std::thread>,_std::allocator<std::shared_ptr<std::thread>_>_>::
    ~vector(&local_d8);
  }
  return;
}

Assistant:

void run() {
    bool has_run_or_stop = false;
    bool ok = has_run_or_stop_.compare_exchange_strong(has_run_or_stop, true);
    if (!ok) {
      return;
    }

    std::vector<std::shared_ptr<std::thread>> threads;
    for (std::size_t i = 0; i < io_contexts_.size(); ++i) {
      threads.emplace_back(std::make_shared<std::thread>(
          [](io_context_ptr svr) {
            auto ctx = get_current();
            *ctx = svr.get();
            svr->run();
          },
          io_contexts_[i]));

#ifdef __linux__
      if (cpu_affinity_) {
        cpu_set_t cpuset;
        CPU_ZERO(&cpuset);
        CPU_SET(i, &cpuset);
        int rc = pthread_setaffinity_np(threads.back()->native_handle(),
                                        sizeof(cpu_set_t), &cpuset);
        if (rc != 0) {
          std::cerr << "Error calling pthread_setaffinity_np: " << rc << "\n";
        }
      }
#endif
    }

    for (std::size_t i = 0; i < threads.size(); ++i) {
      threads[i]->join();
    }
    promise_.set_value();
  }